

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureBlitterPrivate::blit
          (QOpenGLTextureBlitterPrivate *this,GLuint texture,QMatrix4x4 *targetTransform,
          Origin origin)

{
  TextureMatrixUniform TVar1;
  long lVar2;
  bool bVar3;
  ProgramIndex PVar4;
  long *plVar5;
  long in_FS_OFFSET;
  QBlitterTextureBinder binder;
  QMatrix3x3 textureTransform;
  QMatrix3x3 sourceTransform;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  binder.m_target = 0xaaaaaaaa;
  QBlitterTextureBinder::QBlitterTextureBinder(&binder,this->currentTarget,texture);
  bVar3 = prepareProgram(this,targetTransform);
  if (bVar3) {
    PVar4 = targetToProgramIndex(this->currentTarget);
    TVar1 = this->programs[PVar4].textureMatrixUniformState;
    if (origin == OriginTopLeft) {
      if (TVar1 != IdentityFlipped) {
        sourceTransform.m[1][1] = -NAN;
        sourceTransform.m[1][2] = -NAN;
        sourceTransform.m[2][0] = -NAN;
        sourceTransform.m[2][1] = -NAN;
        sourceTransform.m[0][0] = -NAN;
        sourceTransform.m[0][1] = -NAN;
        sourceTransform.m[0][2] = -NAN;
        sourceTransform.m[1][0] = -NAN;
        sourceTransform.m[2][2] = -NAN;
        QGenericMatrix<3,_3,_float>::setToIdentity(&sourceTransform);
        sourceTransform.m[1][1] = -1.0;
        sourceTransform.m[2][1] = 1.0;
        textureTransform.m[1][1] = -NAN;
        textureTransform.m[1][2] = -NAN;
        textureTransform.m[2][0] = -NAN;
        textureTransform.m[2][1] = -NAN;
        textureTransform.m[0][0] = -NAN;
        textureTransform.m[0][1] = -NAN;
        textureTransform.m[0][2] = -NAN;
        textureTransform.m[1][0] = -NAN;
        textureTransform.m[2][2] = -NAN;
        toTextureCoordinates(&textureTransform,this,&sourceTransform);
        QOpenGLShaderProgram::setUniformValue
                  (this->programs[PVar4].glProgram.d,
                   this->programs[PVar4].textureTransformUniformPos,&textureTransform);
        this->programs[PVar4].textureMatrixUniformState = IdentityFlipped;
      }
    }
    else if (TVar1 != Identity) {
      sourceTransform.m[1][1] = -NAN;
      sourceTransform.m[1][2] = -NAN;
      sourceTransform.m[2][0] = -NAN;
      sourceTransform.m[2][1] = -NAN;
      sourceTransform.m[0][0] = -NAN;
      sourceTransform.m[0][1] = -NAN;
      sourceTransform.m[0][2] = -NAN;
      sourceTransform.m[1][0] = -NAN;
      sourceTransform.m[2][2] = -NAN;
      QGenericMatrix<3,_3,_float>::setToIdentity(&textureTransform);
      toTextureCoordinates(&sourceTransform,this,&textureTransform);
      QOpenGLShaderProgram::setUniformValue
                (this->programs[PVar4].glProgram.d,this->programs[PVar4].textureTransformUniformPos,
                 &sourceTransform);
      this->programs[PVar4].textureMatrixUniformState = Identity;
    }
    QOpenGLContext::currentContext();
    plVar5 = (long *)QOpenGLContext::functions();
    (**(code **)(*plVar5 + 0x78))(4,0,6);
  }
  QBlitterTextureBinder::~QBlitterTextureBinder(&binder);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureBlitterPrivate::blit(GLuint texture,
                                        const QMatrix4x4 &targetTransform,
                                        QOpenGLTextureBlitter::Origin origin)
{
    QBlitterTextureBinder binder(currentTarget, texture);
    if (!prepareProgram(targetTransform))
        return;

    Program *program = &programs[targetToProgramIndex(currentTarget)];

    if (origin == QOpenGLTextureBlitter::OriginTopLeft) {
        if (program->textureMatrixUniformState != IdentityFlipped) {
            QMatrix3x3 sourceTransform;
            sourceTransform(1,1) = -1;
            sourceTransform(1,2) = 1;
            const QMatrix3x3 textureTransform = toTextureCoordinates(sourceTransform);
            program->glProgram->setUniformValue(program->textureTransformUniformPos, textureTransform);
            program->textureMatrixUniformState = IdentityFlipped;
        }
    } else if (program->textureMatrixUniformState != Identity) {
        const QMatrix3x3 textureTransform = toTextureCoordinates(QMatrix3x3());
        program->glProgram->setUniformValue(program->textureTransformUniformPos, textureTransform);
        program->textureMatrixUniformState = Identity;
    }

    QOpenGLContext::currentContext()->functions()->glDrawArrays(GL_TRIANGLES, 0, 6);
}